

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_encode_as_hex_Test::
~HexEncoderTest_test_encode_as_hex_Test(HexEncoderTest_test_encode_as_hex_Test *this)

{
  HexEncoderTest_test_encode_as_hex_Test *this_local;
  
  ~HexEncoderTest_test_encode_as_hex_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HexEncoderTest, test_encode_as_hex)
{
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) "", 0));
    ASSERT_EQ("3a", HexEncoder::EncodeAsHex((unsigned char *) ":", 1));
    ASSERT_EQ("60", HexEncoder::EncodeAsHex((unsigned char *) "`", 1));
    ASSERT_EQ("61", HexEncoder::EncodeAsHex((unsigned char *) "a", 1));
    ASSERT_EQ("5d", HexEncoder::EncodeAsHex((unsigned char *) "]", 1));
    ASSERT_EQ("7b", HexEncoder::EncodeAsHex((unsigned char *) "{", 1));
    ASSERT_EQ("3a60615d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 5));
}